

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCut.c
# Opt level: O0

Vec_Int_t * Abc_NtkGetNodeAttributes(Abc_Ntk_t *pNtk)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p;
  Abc_Obj_t *pObj_00;
  Abc_Obj_t *pAVar3;
  uint local_2c;
  int nMffc;
  int nMffcsTotal;
  int nNodesTotal;
  int i;
  Abc_Obj_t *pObj;
  Vec_Int_t *vAttrs;
  Abc_Ntk_t *pNtk_local;
  
  nMffc = 0;
  local_2c = 0;
  iVar1 = Abc_NtkObjNumMax(pNtk);
  p = Vec_IntStart(iVar1 + 1);
  for (nMffcsTotal = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), nMffcsTotal < iVar1;
      nMffcsTotal = nMffcsTotal + 1) {
    pObj_00 = Abc_NtkObj(pNtk,nMffcsTotal);
    if (pObj_00 != (Abc_Obj_t *)0x0) {
      iVar1 = Abc_ObjIsNode(pObj_00);
      if (iVar1 != 0) {
        nMffc = nMffc + 1;
      }
      iVar1 = Abc_ObjIsCo(pObj_00);
      if (iVar1 != 0) {
        pAVar3 = Abc_ObjFanin0(pObj_00);
        iVar1 = Abc_ObjIsNode(pAVar3);
        if (iVar1 != 0) {
          pAVar3 = Abc_ObjFanin0(pObj_00);
          iVar1 = Abc_NodeMffcSize(pAVar3);
          local_2c = iVar1 + local_2c;
        }
      }
      iVar1 = Abc_ObjIsNode(pObj_00);
      if (((iVar1 != 0) && (iVar1 = Abc_ObjFanoutNum(pObj_00), 1 < iVar1)) &&
         (iVar1 = Abc_NodeIsMuxControlType(pObj_00), iVar1 == 0)) {
        iVar1 = Abc_NodeMffcSize(pObj_00);
        iVar2 = Abc_NodeMffcSize(pObj_00);
        local_2c = iVar2 + local_2c;
        if ((2 < iVar1) || (iVar1 = Abc_ObjFanoutNum(pObj_00), 8 < iVar1)) {
          Vec_IntWriteEntry(p,pObj_00->Id,1);
        }
      }
    }
  }
  printf("Total nodes = %d. Total MFFC nodes = %d.\n",(ulong)(uint)nMffc,(ulong)local_2c);
  return p;
}

Assistant:

Vec_Int_t * Abc_NtkGetNodeAttributes( Abc_Ntk_t * pNtk ) 
{
    Vec_Int_t * vAttrs;
//    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pObj;//, * pTemp;
    int i;//, k;
    int nNodesTotal = 0, nMffcsTotal = 0;
    extern Vec_Ptr_t * Abc_NodeMffcInsideCollect( Abc_Obj_t * pNode );

    vAttrs = Vec_IntStart( Abc_NtkObjNumMax(pNtk) + 1 );
//    Abc_NtkForEachCi( pNtk, pObj, i )
//        Vec_IntWriteEntry( vAttrs, pObj->Id, 1 );

    Abc_NtkForEachObj( pNtk, pObj, i )
    {
        if ( Abc_ObjIsNode(pObj) )
            nNodesTotal++;
        if ( Abc_ObjIsCo(pObj) && Abc_ObjIsNode(Abc_ObjFanin0(pObj)) )
            nMffcsTotal += Abc_NodeMffcSize( Abc_ObjFanin0(pObj) );
//        if ( Abc_ObjIsNode(pObj) && (rand() % 4 == 0) )
//        if ( Abc_ObjIsNode(pObj) && Abc_ObjFanoutNum(pObj) > 1 && !Abc_NodeIsMuxControlType(pObj) && (rand() % 3 == 0) )
        if ( Abc_ObjIsNode(pObj) && Abc_ObjFanoutNum(pObj) > 1 && !Abc_NodeIsMuxControlType(pObj) )
        {
            int nMffc = Abc_NodeMffcSize(pObj);
            nMffcsTotal += Abc_NodeMffcSize(pObj);
//            printf( "%d ", nMffc );

            if ( nMffc > 2 || Abc_ObjFanoutNum(pObj) > 8 )
                Vec_IntWriteEntry( vAttrs, pObj->Id, 1 );
        }
    }
/*
    Abc_NtkForEachObj( pNtk, pObj, i )
    {
        if ( Vec_IntEntry( vAttrs, pObj->Id ) )
        {
            vNodes = Abc_NodeMffcInsideCollect( pObj );
            Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pTemp, k )
                if ( pTemp != pObj )
                    Vec_IntWriteEntry( vAttrs, pTemp->Id, 0 );
            Vec_PtrFree( vNodes );
        }
    }
*/
    printf( "Total nodes = %d. Total MFFC nodes = %d.\n", nNodesTotal, nMffcsTotal );
    return vAttrs; 
}